

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

bool ON::IsDirectory(char *utf8pathname)

{
  ON_Internal_Empty_aString *pOVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  ON_String OVar6;
  bool bVar7;
  ON_String buffer;
  stat buf;
  ON_String local_a8;
  stat local_a0;
  
  if ((utf8pathname == (char *)0x0) || (*utf8pathname == '\0')) {
    bVar7 = false;
  }
  else {
    ON_String::ON_String(&local_a8);
    pcVar3 = utf8pathname;
    do {
      pcVar5 = pcVar3;
      pcVar3 = pcVar5 + 1;
    } while (*pcVar5 != '\0');
    cVar2 = pcVar5[-1];
    if ((cVar2 == '\\') || (cVar2 == '/')) {
      local_a0.st_dev._1_1_ = 0;
      local_a0.st_dev._0_1_ = cVar2;
      ON_String::operator=(&local_a8,utf8pathname);
      ON_String::TrimRight(&local_a8,(char *)&local_a0);
      pOVar1 = (ON_Internal_Empty_aString *)(local_a8.m_s + -0xc);
      OVar6.m_s = local_a8.m_s;
      if (local_a8.m_s == &empty_astring.s) {
        OVar6.m_s = "";
      }
      if (local_a8.m_s == (char *)0x0) {
        OVar6.m_s = "";
        pOVar1 = &empty_astring;
      }
      if (0 < (pOVar1->header).string_length) {
        utf8pathname = OVar6.m_s;
      }
    }
    memset(&local_a0,0,0x90);
    iVar4 = stat(utf8pathname,&local_a0);
    bVar7 = (local_a0.st_mode & 0xf000) == 0x4000 && iVar4 == 0;
    ON_String::~ON_String(&local_a8);
  }
  return bVar7;
}

Assistant:

bool ON::IsDirectory( const char* utf8pathname )
{
  bool rc = false;

  if ( 0 != utf8pathname && 0 != utf8pathname[0] )
  {
    ON_String buffer;
    const char* stail = utf8pathname;
    while ( 0 != *stail )
      stail++;
    stail--;
    if ( '\\' == *stail || '/' == *stail ) 
    {
      const char trim[2] = {*stail,0};
      buffer = utf8pathname;
      buffer.TrimRight(trim);
      if ( buffer.Length() > 0 )
        utf8pathname = static_cast< const char* >(buffer);
    }
#if defined(ON_COMPILER_MSC)
    // this works on Windows
    struct _stat64 buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = _stat64( utf8pathname, &buf );
    if ( 0 == stat_errno && 0 != (_S_IFDIR & buf.st_mode) )
    {
      rc = true;
    }
#else
    // this works on Apple and gcc implementations.
    struct stat buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = stat( utf8pathname, &buf );
    if ( 0 == stat_errno && S_ISDIR(buf.st_mode) )
    {
      rc = true;
    }
#endif
  }

  return rc;
}